

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTport.c
# Opt level: O0

void sbfTportFree(sbfTport tport)

{
  undefined8 *in_RDI;
  u_int i;
  uint local_c;
  
  pthread_cond_destroy((pthread_cond_t *)(in_RDI + 0x35));
  pthread_mutex_destroy((pthread_mutex_t *)(in_RDI + 0x30));
  for (local_c = 0; local_c < *(uint *)(in_RDI + 0x2c); local_c = local_c + 1) {
    regfree((regex_t *)(in_RDI[0x2d] + (ulong)local_c * 0x48 + 8));
  }
  free((void *)in_RDI[0x2d]);
  pthread_mutex_destroy((pthread_mutex_t *)(in_RDI + 0x27));
  sbfKeyValue_destroy(in_RDI[3]);
  free((void *)*in_RDI);
  free(in_RDI);
  return;
}

Assistant:

static void
sbfTportFree (sbfTport tport)
{
    u_int i;

    sbfCondVar_destroy (&tport->mStreamsCondVar);
    sbfMutex_destroy (&tport->mStreamsLock);

    for (i = 0; i < tport->mWeightsListSize; i++)
        regfree (&tport->mWeightsList[i].mPattern);
    free (tport->mWeightsList);
    sbfMutex_destroy (&tport->mWeightsLock);

    sbfKeyValue_destroy (tport->mProperties);

    free ((void*)tport->mName);
    free (tport);
}